

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O2

void lws_wsi_mux_dump_children(lws *wsi)

{
  lws *plVar1;
  int iVar2;
  lws *plVar3;
  char *pcVar4;
  lws **pplVar5;
  
  if ((wsi->mux).parent_wsi != (lws *)0x0) {
    iVar2 = lwsl_visible(8);
    if (iVar2 != 0) {
      plVar1 = (wsi->mux).parent_wsi;
      plVar3 = (plVar1->mux).child_list;
      pplVar5 = &(plVar1->mux).child_list;
      while (plVar3 != (lws *)0x0) {
        pcVar4 = "?";
        if (plVar3->role_ops != (lws_role_ops *)0x0) {
          pcVar4 = plVar3->role_ops->name;
        }
        _lws_log(8,"   \\---- child %s %p\n",pcVar4);
        plVar1 = *pplVar5;
        pplVar5 = &(plVar1->mux).sibling_list;
        plVar3 = (plVar1->mux).sibling_list;
        if (plVar1 == plVar3) {
          __assert_fail("*w != (*w)->mux.sibling_list",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core-net/wsi.c"
                        ,0x450,"void lws_wsi_mux_dump_children(struct lws *)");
        }
      }
    }
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_children(struct lws *wsi)
{
#if defined(_DEBUG)
	if (!wsi->mux.parent_wsi || !lwsl_visible(LLL_INFO))
		return;

	lws_start_foreach_llp(struct lws **, w,
			      wsi->mux.parent_wsi->mux.child_list) {
		lwsl_info("   \\---- child %s %p\n",
			  (*w)->role_ops ? (*w)->role_ops->name : "?", *w);
		assert(*w != (*w)->mux.sibling_list);
	} lws_end_foreach_llp(w, mux.sibling_list);
#endif
}